

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcore_desktop_glfw.c
# Opt level: O2

void MouseButtonCallback(GLFWwindow *window,int button,int action,int mods)

{
  long lVar1;
  char cVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  byte bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  GestureEvent in_stack_ffffffffffffff18;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 extraout_XMM0_Qb;
  
  bVar5 = 0;
  cVar2 = (char)action;
  CORE.Input.Mouse.currentButtonState[button] = cVar2;
  CORE.Input.Touch.currentTouchState[button] = cVar2;
  local_28 = 0;
  uStack_20 = 0;
  local_38 = 0;
  uStack_30 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_6c = 0;
  local_18 = 0;
  if ((cVar2 == '\x01') && (CORE.Input.Mouse.previousButtonState[button] == '\0')) {
    local_78 = 1;
  }
  uStack_74 = 1;
  uStack_70 = 0;
  auVar6._0_8_ = GetMousePosition();
  auVar6._8_8_ = extraout_XMM0_Qb;
  auVar7._4_4_ = (float)(int)CORE.Window.screen.height;
  auVar7._0_4_ = (float)(int)CORE.Window.screen.width;
  auVar7._8_8_ = 0;
  auVar7 = divps(auVar6,auVar7);
  uStack_50 = auVar7._0_8_;
  puVar3 = (undefined8 *)&local_78;
  puVar4 = (undefined8 *)&stack0xffffffffffffff18;
  for (lVar1 = 0xd; lVar1 != 0; lVar1 = lVar1 + -1) {
    *puVar4 = *puVar3;
    puVar3 = puVar3 + (ulong)bVar5 * -2 + 1;
    puVar4 = puVar4 + (ulong)bVar5 * -2 + 1;
  }
  ProcessGestureEvent(in_stack_ffffffffffffff18);
  return;
}

Assistant:

static void MouseButtonCallback(GLFWwindow *window, int button, int action, int mods)
{
    // WARNING: GLFW could only return GLFW_PRESS (1) or GLFW_RELEASE (0) for now,
    // but future releases may add more actions (i.e. GLFW_REPEAT)
    CORE.Input.Mouse.currentButtonState[button] = action;
    CORE.Input.Touch.currentTouchState[button] = action;

#if defined(SUPPORT_GESTURES_SYSTEM) && defined(SUPPORT_MOUSE_GESTURES)
    // Process mouse events as touches to be able to use mouse-gestures
    GestureEvent gestureEvent = { 0 };

    // Register touch actions
    if ((CORE.Input.Mouse.currentButtonState[button] == 1) && (CORE.Input.Mouse.previousButtonState[button] == 0)) gestureEvent.touchAction = TOUCH_ACTION_DOWN;
    else if ((CORE.Input.Mouse.currentButtonState[button] == 0) && (CORE.Input.Mouse.previousButtonState[button] == 1)) gestureEvent.touchAction = TOUCH_ACTION_UP;

    // NOTE: TOUCH_ACTION_MOVE event is registered in MouseCursorPosCallback()

    // Assign a pointer ID
    gestureEvent.pointId[0] = 0;

    // Register touch points count
    gestureEvent.pointCount = 1;

    // Register touch points position, only one point registered
    gestureEvent.position[0] = GetMousePosition();

    // Normalize gestureEvent.position[0] for CORE.Window.screen.width and CORE.Window.screen.height
    gestureEvent.position[0].x /= (float)GetScreenWidth();
    gestureEvent.position[0].y /= (float)GetScreenHeight();

    // Gesture data is sent to gestures-system for processing
    ProcessGestureEvent(gestureEvent);
#endif
}